

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.h
# Opt level: O3

void __thiscall CompilationContext::Poolable::Poolable(Poolable *this,CompilationContext *ctx_)

{
  pointer *pppPVar1;
  iterator __position;
  Poolable *local_8;
  
  this->ctx = ctx_;
  __position._M_current =
       (ctx_->poolableObjects).
       super__Vector_base<CompilationContext::Poolable_*,_std::allocator<CompilationContext::Poolable_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (ctx_->poolableObjects).
      super__Vector_base<CompilationContext::Poolable_*,_std::allocator<CompilationContext::Poolable_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = this;
    std::vector<CompilationContext::Poolable*,std::allocator<CompilationContext::Poolable*>>::
    _M_realloc_insert<CompilationContext::Poolable*>
              ((vector<CompilationContext::Poolable*,std::allocator<CompilationContext::Poolable*>>
                *)&ctx_->poolableObjects,__position,&local_8);
  }
  else {
    *__position._M_current = this;
    pppPVar1 = &(ctx_->poolableObjects).
                super__Vector_base<CompilationContext::Poolable_*,_std::allocator<CompilationContext::Poolable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

Poolable(CompilationContext & ctx_) : ctx(ctx_)
    {
      ctx.poolableObjects.push_back(this);
    }